

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O1

void __thiscall
dnet::data_types::tensor<int,_3U>::tensor(tensor<int,_3U> *this,array<unsigned_int,_3UL> size)

{
  (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(long *)(this->_shape)._M_elems = size._M_elems._0_8_;
  (this->_shape)._M_elems[2] = size._M_elems[2];
  init(this,(EVP_PKEY_CTX *)&this->_shape);
  return;
}

Assistant:

tensor<T, N>::tensor(std::array<index_type, N> size)
        {
            for (auto iter = size.begin(); iter != size.end(); iter++) {
                unsigned long i = iter - size.begin();
                if (i >= N) {
                    break;
                }
                this->_shape[i] = *iter;
            }
            this->init(this->_shape);
        }